

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_fdset(CURLM *m,fd_set *read_fd_set,fd_set *write_fd_set,fd_set *exc_fd_set,
                          int *max_fd)

{
  byte bVar1;
  int iVar2;
  _Bool _Var3;
  CURLMcode CVar4;
  Curl_easy *data;
  ulong uVar5;
  int iVar6;
  uint mid;
  easy_pollset ps;
  uint local_58;
  int local_54;
  easy_pollset local_50;
  
  local_54 = -1;
  CVar4 = CURLM_BAD_HANDLE;
  if (((m != (CURLM *)0x0) && (*m == 0xbab1e)) &&
     (CVar4 = CURLM_RECURSIVE_API_CALL, (*(byte *)((long)m + 0x271) & 4) == 0)) {
    _Var3 = Curl_uint_bset_first((uint_bset *)((long)m + 0x28),&local_58);
    if (_Var3) {
      do {
        data = Curl_multi_get_easy((Curl_multi *)m,local_58);
        if (data != (Curl_easy *)0x0) {
          Curl_multi_getsock(data,&local_50,"curl_multi_fdset");
          if ((ulong)local_50.num != 0) {
            uVar5 = 0;
            do {
              iVar2 = local_50.sockets[uVar5];
              if (iVar2 < 0x400) {
                bVar1 = local_50.actions[uVar5];
                if ((bVar1 & 1) != 0) {
                  iVar6 = iVar2 + 0x3f;
                  if (-1 < iVar2) {
                    iVar6 = iVar2;
                  }
                  read_fd_set->fds_bits[iVar6 >> 6] =
                       read_fd_set->fds_bits[iVar6 >> 6] | 1L << ((byte)iVar2 & 0x3f);
                }
                if ((bVar1 & 2) != 0) {
                  iVar6 = iVar2 + 0x3f;
                  if (-1 < iVar2) {
                    iVar6 = iVar2;
                  }
                  write_fd_set->fds_bits[iVar6 >> 6] =
                       write_fd_set->fds_bits[iVar6 >> 6] | 1L << ((byte)iVar2 & 0x3f);
                }
                if (local_54 < iVar2) {
                  local_54 = iVar2;
                }
              }
              uVar5 = uVar5 + 1;
            } while (local_50.num != uVar5);
          }
        }
        _Var3 = Curl_uint_bset_next((uint_bset *)((long)m + 0x28),local_58,&local_58);
      } while (_Var3);
    }
    Curl_cshutdn_setfds((cshutdn *)((long)m + 0x188),*(Curl_easy **)((long)m + 0x78),read_fd_set,
                        write_fd_set,&local_54);
    *max_fd = local_54;
    CVar4 = CURLM_OK;
  }
  return CVar4;
}

Assistant:

CURLMcode curl_multi_fdset(CURLM *m,
                           fd_set *read_fd_set, fd_set *write_fd_set,
                           fd_set *exc_fd_set, int *max_fd)
{
  /* Scan through all the easy handles to get the file descriptors set.
     Some easy handles may not have connected to the remote host yet,
     and then we must make sure that is done. */
  int this_max_fd = -1;
  struct Curl_multi *multi = m;
  unsigned int i, mid;
  (void)exc_fd_set; /* not used */

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  if(Curl_uint_bset_first(&multi->process, &mid)) {
    do {
      struct Curl_easy *data = Curl_multi_get_easy(multi, mid);
      struct easy_pollset ps;

      if(!data) {
        DEBUGASSERT(0);
        continue;
      }

      Curl_multi_getsock(data, &ps, "curl_multi_fdset");
      for(i = 0; i < ps.num; i++) {
        if(!FDSET_SOCK(ps.sockets[i]))
          /* pretend it does not exist */
          continue;
#if defined(__DJGPP__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Warith-conversion"
#endif
        if(ps.actions[i] & CURL_POLL_IN)
          FD_SET(ps.sockets[i], read_fd_set);
        if(ps.actions[i] & CURL_POLL_OUT)
          FD_SET(ps.sockets[i], write_fd_set);
#if defined(__DJGPP__)
#pragma GCC diagnostic pop
#endif
        if((int)ps.sockets[i] > this_max_fd)
          this_max_fd = (int)ps.sockets[i];
      }
    }
    while(Curl_uint_bset_next(&multi->process, mid, &mid));
  }

  Curl_cshutdn_setfds(&multi->cshutdn, multi->admin,
                      read_fd_set, write_fd_set, &this_max_fd);

  *max_fd = this_max_fd;

  return CURLM_OK;
}